

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_29a6bd::SerialQueueImpl::addOperation
          (SerialQueueImpl *this,function<void_()> *fn)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  function<void_()> *fn_local;
  SerialQueueImpl *this_local;
  
  guard._M_device = (mutex_type *)fn;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->operationsMutex);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->operations,(value_type *)guard._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void addOperation(std::function<void(void)>&& fn) {
    std::lock_guard<std::mutex> guard(operationsMutex);
    operations.push_back(fn);
    readyOperationsCondition.notify_one();
  }